

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# codeemitter.cpp
# Opt level: O0

Label __thiscall
asmjit::CodeEmitter::getLabelByName
          (CodeEmitter *this,char *name,size_t nameLength,uint32_t parentId)

{
  long in_RSI;
  undefined8 *in_RDI;
  Label LVar1;
  uint32_t local_b4;
  undefined8 in_stack_ffffffffffffff98;
  undefined4 in_stack_ffffffffffffffa0;
  undefined4 in_stack_ffffffffffffffa4;
  char *in_stack_ffffffffffffffa8;
  undefined4 in_stack_ffffffffffffffb0;
  undefined4 in_stack_ffffffffffffffb4;
  
  if (*(long *)(in_RSI + 0x18) == 0) {
    local_b4 = 0;
  }
  else {
    local_b4 = CodeHolder::getLabelIdByName
                         ((CodeHolder *)
                          CONCAT44(in_stack_ffffffffffffffb4,in_stack_ffffffffffffffb0),
                          in_stack_ffffffffffffffa8,
                          CONCAT44(in_stack_ffffffffffffffa4,in_stack_ffffffffffffffa0),
                          (uint32_t)((ulong)in_stack_ffffffffffffff98 >> 0x20));
  }
  *in_RDI = CONCAT44(local_b4,4);
  in_RDI[1] = 0;
  LVar1.super_Operand.super_Operand_.field_0._mem.field_2 =
       (anon_union_8_2_78723da6_for_MemData_2)0x0;
  LVar1.super_Operand.super_Operand_.field_0._packed[0] = (UInt64)in_RDI;
  return (Label)LVar1.super_Operand.super_Operand_.field_0;
}

Assistant:

Label CodeEmitter::getLabelByName(const char* name, size_t nameLength, uint32_t parentId) noexcept {
  return Label(_code ? _code->getLabelIdByName(name, nameLength, parentId) : static_cast<uint32_t>(0));
}